

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void objini(mcmcxdef *mctx,int sccnt,objnum objn,int classflg)

{
  ushort *puVar1;
  uchar *puVar2;
  undefined6 in_register_00000012;
  uint16_t tmp;
  
  puVar2 = mcmlck(mctx,objn);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  *(short *)(puVar2 + 4) = (short)sccnt;
  *(short *)(puVar2 + 8) = (short)sccnt * 2 + 0xe;
  *(ushort *)(puVar2 + 2) = (ushort)(classflg != 0);
  puVar1 = (ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab
                   [mctx->mcmcxmtb[(CONCAT62(in_register_00000012,objn) & 0xffffffff) >> 8]
                    [(uint)CONCAT62(in_register_00000012,objn) & 0xff] >> 8]->mcmoflg +
           (ulong)((mctx->mcmcxmtb[(CONCAT62(in_register_00000012,objn) & 0xffffffff) >> 8]
                    [(uint)CONCAT62(in_register_00000012,objn) & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,objn);
  return;
}

Assistant:

void objini(mcmcxdef *mctx, int sccnt, objnum objn, int classflg)
{
    objdef *o;
    uint    flags = 0;

    /* get a lock on the object */
    o = (objdef *)mcmlck(mctx, objn);
    
    memset(o, 0, (size_t)10);
    objsnsc(o, sccnt);
    objsfree(o, ((uchar *)objsc(o) + 2*sccnt) - (uchar *)o);
    
    /* set up flags */
    if (classflg) flags |= OBJFCLASS;
    objsflg(o, flags);

    /* tell cache manager that this object has been modified */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}